

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnCheckpointState::FlushSegmentInternal
          (ColumnCheckpointState *this,
          unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
          *segment,idx_t segment_size)

{
  PartialBlockManager *this_00;
  data_ptr_t pdVar1;
  ColumnData *pCVar2;
  CompressionFunction *pCVar3;
  compression_serialize_state_t p_Var4;
  PartialBlockState state;
  PartialBlock *pPVar5;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var6;
  undefined8 block_manager;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var7;
  bool bVar8;
  uint segment_size_00;
  BlockManager *pBVar9;
  idx_t iVar10;
  idx_t iVar11;
  pointer pCVar12;
  pointer this_01;
  BufferManager *pBVar13;
  pointer pPVar14;
  type pCVar15;
  unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_> this_02;
  reference pvVar16;
  uint32_t uVar17;
  block_id_t bVar18;
  BufferHandle old_handle;
  unique_lock<std::mutex> partial_block_lock;
  DataPointer data_pointer;
  BufferHandle new_handle;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_1b0;
  ulong local_1a8;
  idx_t local_1a0;
  undefined1 local_198 [32];
  undefined1 local_178;
  block_id_t local_170;
  element_type *local_168;
  uint local_15c;
  undefined1 local_158 [40];
  BaseStatistics local_130;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> local_d8;
  BufferHandle local_d0;
  PartialBlockAllocation local_b8;
  BaseStatistics local_88;
  
  pBVar9 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  iVar10 = optional_idx::GetIndex(&pBVar9->block_alloc_size);
  iVar11 = optional_idx::GetIndex(&pBVar9->block_header_size);
  pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(segment);
  local_168 = (element_type *)
              (pCVar12->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
  if (local_168 != (element_type *)0x0) {
    local_1a0 = segment_size;
    this_01 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->(&this->global_stats);
    pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator->(segment);
    BaseStatistics::Merge(this_01,&(pCVar12->stats).statistics);
    pBVar13 = BufferManager::GetBufferManager(this->column_data->info->db->db);
    local_198._24_8_ = 0;
    local_178 = 0;
    pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator->(segment);
    bVar8 = BaseStatistics::IsConstant(&(pCVar12->stats).statistics);
    if (bVar8) {
      pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                ::operator->(segment);
      bVar18 = -1;
      uVar17 = 0;
      ColumnSegment::ConvertToPersistent(pCVar12,(optional_ptr<duckdb::BlockManager,_true>)0x0,-1);
    }
    else {
      local_158._0_8_ = &this->partial_block_manager->partial_block_lock;
      local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_158);
      local_158[8] = 1;
      ::std::unique_lock<std::mutex>::operator=
                ((unique_lock<std::mutex> *)(local_198 + 0x18),(unique_lock<std::mutex> *)local_158)
      ;
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_158);
      this_00 = this->partial_block_manager;
      segment_size_00 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(local_1a0);
      PartialBlockManager::GetBlockAllocation
                ((PartialBlockAllocation *)local_158,this_00,segment_size_00);
      local_170 = local_158._16_8_;
      local_1a8 = (ulong)(uint)local_158._28_4_;
      if ((__uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
          local_130.type._0_8_ ==
          (__uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)0x0) {
        pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator->(segment);
        if (pCVar12->segment_size != iVar10 - iVar11) {
          pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                    ::operator->(segment);
          ColumnSegment::Resize(pCVar12,iVar10 - iVar11);
        }
        pCVar2 = this->column_data;
        pCVar15 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator*(segment);
        block_manager = local_158._0_8_;
        this_02._M_t.
        super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
        super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
              )operator_new(0x68);
        state._17_7_ = local_158._33_7_;
        state.block_use_count._0_1_ = local_158[0x20];
        state.offset = local_158._28_4_;
        state.block_size = local_158._24_4_;
        state.block_id = local_158._16_8_;
        PartialBlockForCheckpoint::PartialBlockForCheckpoint
                  ((PartialBlockForCheckpoint *)
                   this_02._M_t.
                   super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
                   .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl,pCVar2,pCVar15
                   ,state,(BlockManager *)block_manager);
        if ((PartialBlockForCheckpoint *)local_130.type._0_8_ != (PartialBlockForCheckpoint *)0x0) {
          pPVar5 = (PartialBlock *)local_130.type._0_8_;
          local_130.type._0_8_ =
               this_02._M_t.
               super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
               .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl;
          (*pPVar5->_vptr_PartialBlock[1])();
          this_02._M_t.
          super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
               (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
                )(__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
                  )local_130.type._0_8_;
        }
      }
      else {
        pPVar14 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                  ::operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                                *)&local_130);
        pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator->(segment);
        (*pBVar13->_vptr_BufferManager[7])(local_198,pBVar13,&pCVar12->block);
        (*pBVar13->_vptr_BufferManager[7])(&local_d0,pBVar13,&pPVar14->block_handle);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_d0.node);
        iVar10 = local_1a0;
        pdVar1 = (local_d0.node.ptr)->buffer;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)(local_198 + 0x10));
        switchD_015df945::default
                  (pdVar1 + local_1a8,
                   (((atomic<duckdb::ColumnSegment_*> *)(local_198._16_8_ + 0x10))->_M_b)._M_p,
                   iVar10);
        pCVar2 = this->column_data;
        pCVar15 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  ::operator*(segment);
        local_15c = (uint)local_1a8;
        ::std::
        vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>>
        ::emplace_back<duckdb::ColumnData&,duckdb::ColumnSegment&,unsigned_int&>
                  ((vector<duckdb::PartialBlockForCheckpoint::PartialColumnSegment,std::allocator<duckdb::PartialBlockForCheckpoint::PartialColumnSegment>>
                    *)(pPVar14 + 1),pCVar2,pCVar15,&local_15c);
        BufferHandle::~BufferHandle(&local_d0);
        BufferHandle::~BufferHandle((BufferHandle *)local_198);
        this_02._M_t.
        super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
        super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
              )(__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
                )local_130.type._0_8_;
      }
      local_130.type._0_8_ =
           this_02._M_t.
           super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
           .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl;
      local_b8.state.block_id = local_158._16_8_;
      local_b8.block_manager = (BlockManager *)local_158._0_8_;
      local_b8._8_8_ = local_158._8_8_;
      local_b8.partial_block.
      super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           local_130.type._0_8_;
      local_130.type._0_8_ = (_Head_base<0UL,_duckdb::PartialBlock_*,_false>)0x0;
      PartialBlockManager::RegisterPartialBlock(this->partial_block_manager,&local_b8);
      bVar18 = local_170;
      uVar17 = (uint32_t)local_1a8;
      if (local_b8.partial_block.
          super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
          super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
          .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_b8.partial_block.
                              super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>
                              .super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl + 8
                    ))();
      }
      local_b8.partial_block.
      super_unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>.
      super__Head_base<0UL,_duckdb::PartialBlock_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>_>)
           (__uniq_ptr_data<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true,_true>
            )0x0;
      if ((_Head_base<0UL,_duckdb::PartialBlock_*,_false>)local_130.type._0_8_ !=
          (_Head_base<0UL,_duckdb::PartialBlock_*,_false>)0x0) {
        (*((PartialBlock *)local_130.type._0_8_)->_vptr_PartialBlock[1])();
      }
    }
    pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator->(segment);
    BaseStatistics::Copy(&local_88,&(pCVar12->stats).statistics);
    DataPointer::DataPointer((DataPointer *)local_158,&local_88);
    BaseStatistics::~BaseStatistics(&local_88);
    local_158._0_8_ = (this->row_group->super_SegmentBase<duckdb::RowGroup>).start;
    local_158._16_8_ = bVar18;
    local_158._24_4_ = uVar17;
    if ((this->data_pointers).
        super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
        super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->data_pointers).
        super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
        super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar16 = vector<duckdb::DataPointer,_true>::back(&this->data_pointers);
      local_158._0_8_ = pvVar16->tuple_count + pvVar16->row_start;
    }
    local_158._8_8_ = local_168;
    pCVar12 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator->(segment);
    pCVar3 = (pCVar12->function)._M_data;
    local_158[0x20] = pCVar3->type;
    p_Var4 = pCVar3->serialize_state;
    if (p_Var4 != (compression_serialize_state_t)0x0) {
      unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator*
                (segment);
      (*p_Var4)((ColumnSegment *)local_198);
      _Var7._M_head_impl = local_d8._M_head_impl;
      local_d8._M_head_impl = (ColumnSegmentState *)local_198._0_8_;
      local_198._0_8_ = (element_type *)0x0;
      if ((__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
           )_Var7._M_head_impl !=
          (tuple<duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>)0x0
         ) {
        (**(code **)(*(long *)_Var7._M_head_impl + 8))();
        if ((element_type *)local_198._0_8_ != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::BlockHandle> *)local_198._0_8_)->
                      __weak_this_).internal.
                      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                    super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
      }
    }
    local_1b0._M_head_impl =
         (segment->
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (segment->super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>).
    _M_t.super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    SegmentTree<duckdb::ColumnSegment,_false>::AppendSegment
              (&(this->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>,
               (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)&local_1b0);
    _Var6._M_head_impl = local_1b0._M_head_impl;
    if (local_1b0._M_head_impl != (ColumnSegment *)0x0) {
      ColumnSegment::~ColumnSegment(local_1b0._M_head_impl);
      operator_delete(_Var6._M_head_impl);
    }
    local_1b0._M_head_impl = (ColumnSegment *)0x0;
    ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
    emplace_back<duckdb::DataPointer>
              (&(this->data_pointers).
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,
               (DataPointer *)local_158);
    if ((_Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>)local_d8._M_head_impl !=
        (_Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::BlockHandle> *)
                   &(local_d8._M_head_impl)->_vptr_ColumnSegmentState)->__weak_this_).internal.
                  super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ();
    }
    local_d8._M_head_impl = (ColumnSegmentState *)0x0;
    BaseStatistics::~BaseStatistics(&local_130);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_198 + 0x18));
  }
  return;
}

Assistant:

void ColumnCheckpointState::FlushSegmentInternal(unique_ptr<ColumnSegment> segment, idx_t segment_size) {
	auto block_size = partial_block_manager.GetBlockManager().GetBlockSize();
	D_ASSERT(segment_size <= block_size);

	auto tuple_count = segment->count.load();
	if (tuple_count == 0) { // LCOV_EXCL_START
		return;
	} // LCOV_EXCL_STOP

	// merge the segment stats into the global stats
	global_stats->Merge(segment->stats.statistics);

	// get the buffer of the segment and pin it
	auto &db = column_data.GetDatabase();
	auto &buffer_manager = BufferManager::GetBufferManager(db);
	block_id_t block_id = INVALID_BLOCK;
	uint32_t offset_in_block = 0;

	unique_lock<mutex> partial_block_lock;
	if (!segment->stats.statistics.IsConstant()) {
		partial_block_lock = partial_block_manager.GetLock();

		// non-constant block
		PartialBlockAllocation allocation =
		    partial_block_manager.GetBlockAllocation(NumericCast<uint32_t>(segment_size));
		block_id = allocation.state.block_id;
		offset_in_block = allocation.state.offset;

		if (allocation.partial_block) {
			// Use an existing block.
			D_ASSERT(offset_in_block > 0);
			auto &pstate = allocation.partial_block->Cast<PartialBlockForCheckpoint>();
			// pin the source block
			auto old_handle = buffer_manager.Pin(segment->block);
			// pin the target block
			auto new_handle = buffer_manager.Pin(pstate.block_handle);
			// memcpy the contents of the old block to the new block
			memcpy(new_handle.Ptr() + offset_in_block, old_handle.Ptr(), segment_size);
			pstate.AddSegmentToTail(column_data, *segment, offset_in_block);
		} else {
			// Create a new block for future reuse.
			if (segment->SegmentSize() != block_size) {
				// the segment is smaller than the block size
				// allocate a new block and copy the data over
				D_ASSERT(segment->SegmentSize() < block_size);
				segment->Resize(block_size);
			}
			D_ASSERT(offset_in_block == 0);
			allocation.partial_block = make_uniq<PartialBlockForCheckpoint>(column_data, *segment, allocation.state,
			                                                                *allocation.block_manager);
		}
		// Writer will decide whether to reuse this block.
		partial_block_manager.RegisterPartialBlock(std::move(allocation));
	} else {
		segment->ConvertToPersistent(nullptr, INVALID_BLOCK);
	}

	// construct the data pointer
	DataPointer data_pointer(segment->stats.statistics.Copy());
	data_pointer.block_pointer.block_id = block_id;
	data_pointer.block_pointer.offset = offset_in_block;
	data_pointer.row_start = row_group.start;
	if (!data_pointers.empty()) {
		auto &last_pointer = data_pointers.back();
		data_pointer.row_start = last_pointer.row_start + last_pointer.tuple_count;
	}
	data_pointer.tuple_count = tuple_count;
	auto &compression_function = segment->GetCompressionFunction();
	data_pointer.compression_type = compression_function.type;
	if (compression_function.serialize_state) {
		data_pointer.segment_state = compression_function.serialize_state(*segment);
	}

	// append the segment to the new segment tree
	new_tree.AppendSegment(std::move(segment));
	data_pointers.push_back(std::move(data_pointer));
}